

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_urbg.cc
# Opt level: O0

result_type_conflict3
absl::lts_20250127::random_internal::RandenPool<unsigned_short>::Generate(void)

{
  uint16_t uVar1;
  RandenPoolEntry *this;
  RandenPoolEntry *pool;
  
  this = anon_unknown_0::GetPoolForCurrentThread();
  uVar1 = anon_unknown_0::RandenPoolEntry::Generate<unsigned_short>(this);
  return uVar1;
}

Assistant:

typename RandenPool<T>::result_type RandenPool<T>::Generate() {
  auto* pool = GetPoolForCurrentThread();
  return pool->Generate<T>();
}